

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::Session::run(Session *this)

{
  Config *config;
  int iVar1;
  Runner runner;
  Totals local_280;
  Runner local_250;
  
  iVar1 = 0;
  if ((this->m_configData).showHelp == false) {
    Session::config(this);
    srand((this->m_configData).rngSeed);
    Runner::Runner(&local_250,&this->m_config);
    config = Session::config(this);
    list((Catch *)&local_280,config);
    if ((undefined8 *)local_280.assertions.passed == (undefined8 *)0x0) {
      Runner::runTests(&local_280,&local_250);
      iVar1 = (int)local_280.assertions.failed;
    }
    else {
      iVar1 = (int)*(undefined8 *)local_280.assertions.passed;
    }
    Runner::~Runner(&local_250);
  }
  return iVar1;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                std::srand( m_configData.rngSeed );

                Runner runner( m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runner.runTests().assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }